

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void mips_tr_tb_stop(DisasContextBase *dcbase,CPUState *cs)

{
  int iVar1;
  TCGContext_conflict6 *tcg_ctx_00;
  TCGArg a2;
  TCGArg a2_00;
  uint uVar2;
  TCGContext_conflict6 *tcg_ctx;
  TCGTemp *args [1];
  TCGTemp *local_18;
  
  tcg_ctx_00 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
  if ((dcbase->singlestep_enabled == true) && (dcbase->is_jmp != DISAS_NORETURN)) {
    if ((dcbase->is_jmp != DISAS_TARGET_1) && ((TranslationBlock *)dcbase->pc_next != dcbase[1].tb))
    {
      tcg_gen_op2_mips64el
                (tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(tcg_ctx_00->cpu_pc + (long)tcg_ctx_00),
                 (TCGArg)dcbase->pc_next);
      dcbase[1].tb = (TranslationBlock *)dcbase->pc_next;
    }
    iVar1 = (int)dcbase[2].pc_next;
    if (iVar1 != *(int *)((long)&dcbase[2].pc_next + 4)) {
      tcg_gen_op2_mips64el
                (tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(tcg_ctx_00->hflags + (long)tcg_ctx_00),
                 (long)iVar1);
      uVar2 = (uint)dcbase[2].pc_next;
      *(uint *)((long)&dcbase[2].pc_next + 4) = uVar2;
      uVar2 = uVar2 & 0x803800;
      if (((uVar2 == 0x800) || (uVar2 == 0x1800)) || (uVar2 == 0x1000)) {
        a2._0_4_ = dcbase[2].is_jmp;
        a2._4_4_ = dcbase[2].num_insns;
        tcg_gen_op2_mips64el
                  (tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(tcg_ctx_00->btarget + (long)tcg_ctx_00),a2)
        ;
      }
    }
    local_18 = (TCGTemp *)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00);
    tcg_gen_callN_mips64el
              (tcg_ctx_00,helper_raise_exception_debug_mips64el,(TCGTemp *)0x0,1,&local_18);
switchD_009926dd_caseD_2:
    return;
  }
  switch(dcbase->is_jmp) {
  case DISAS_NEXT:
  case DISAS_TOO_MANY:
    iVar1 = (int)dcbase[2].pc_next;
    if (iVar1 != *(int *)((long)&dcbase[2].pc_next + 4)) {
      tcg_gen_op2_mips64el
                (tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(tcg_ctx_00->hflags + (long)tcg_ctx_00),
                 (long)iVar1);
      uVar2 = (uint)dcbase[2].pc_next;
      *(uint *)((long)&dcbase[2].pc_next + 4) = uVar2;
      uVar2 = uVar2 & 0x803800;
      if (((uVar2 == 0x800) || (uVar2 == 0x1800)) || (uVar2 == 0x1000)) {
        a2_00._0_4_ = dcbase[2].is_jmp;
        a2_00._4_4_ = dcbase[2].num_insns;
        tcg_gen_op2_mips64el
                  (tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(tcg_ctx_00->btarget + (long)tcg_ctx_00),
                   a2_00);
      }
    }
    gen_goto_tb((DisasContext_conflict6 *)dcbase,0,dcbase->pc_next);
    return;
  case DISAS_NORETURN:
    goto switchD_009926dd_caseD_2;
  case DISAS_TARGET_0:
    tcg_gen_op2_mips64el
              (tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(tcg_ctx_00->cpu_pc + (long)tcg_ctx_00),
               dcbase->pc_next);
    tcg_gen_lookup_and_goto_ptr_mips64el(tcg_ctx_00);
    return;
  case DISAS_TARGET_1:
    tcg_gen_exit_tb_mips64el(tcg_ctx_00,(TranslationBlock *)0x0,0);
    return;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/translate.c"
               ,0x7955,(char *)0x0);
  }
}

Assistant:

static void mips_tr_tb_stop(DisasContextBase *dcbase, CPUState *cs)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    if (ctx->base.singlestep_enabled && ctx->base.is_jmp != DISAS_NORETURN) {
        save_cpu_state(ctx, ctx->base.is_jmp != DISAS_EXIT);
        gen_helper_raise_exception_debug(tcg_ctx, tcg_ctx->cpu_env);
    } else {
        switch (ctx->base.is_jmp) {
        case DISAS_STOP:
            gen_save_pc(tcg_ctx, ctx->base.pc_next);
            tcg_gen_lookup_and_goto_ptr(tcg_ctx);
            break;
        case DISAS_NEXT:
        case DISAS_TOO_MANY:
            save_cpu_state(ctx, 0);
            gen_goto_tb(ctx, 0, ctx->base.pc_next);
            break;
        case DISAS_EXIT:
            tcg_gen_exit_tb(tcg_ctx, NULL, 0);
            break;
        case DISAS_NORETURN:
            break;
        default:
            g_assert_not_reached();
        }
    }
}